

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.cc
# Opt level: O3

InputGraph read_csv_name(istream *infile,string *filename,string *name_map_filename)

{
  __buckets_ptr pp_Var1;
  _Head_base<0UL,_InputGraph::Imp_*,_false> _Var2;
  char cVar3;
  istream *piVar4;
  void *pvVar5;
  GraphFileError *pGVar6;
  string *in_RCX;
  size_type __n;
  string left;
  string line;
  string right;
  optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  rename_map;
  ifstream name_map_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string *local_2e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_2e0;
  string *local_2a8;
  _Head_base<0UL,_InputGraph::Imp_*,_false> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [56];
  bool local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_2e8 = name_map_filename;
  local_2a8 = filename;
  local_2a0._M_head_impl = (Imp *)infile;
  std::ifstream::ifstream((istream *)local_238,(string *)in_RCX,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
    local_278._0_8_ = local_278 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,"could not open rename map file","");
    GraphFileError::GraphFileError(pGVar6,in_RCX,(string *)local_278,false);
    __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  local_2e0._M_buckets = &local_2e0._M_single_bucket;
  local_2e0._M_bucket_count = 1;
  local_2e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2e0._M_element_count = 0;
  local_2e0._M_rehash_policy._M_max_load_factor = 1.0;
  local_2e0._M_rehash_policy._4_4_ = 0;
  local_2e0._M_rehash_policy._M_next_resize = 0;
  local_2e0._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)local_278,&local_2e0,&local_2e0);
  local_240 = true;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_2e0);
  local_2e0._M_buckets = &local_2e0._M_before_begin._M_nxt;
  local_2e0._M_bucket_count = 0;
  local_2e0._M_before_begin._M_nxt = local_2e0._M_before_begin._M_nxt & 0xffffffffffffff00;
  while( true ) {
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_2e0,cVar3);
    _Var2._M_head_impl = local_2a0._M_head_impl;
    pp_Var1 = local_2e0._M_buckets;
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      anon_unknown.dwarf_399996::read_csv
                ((anon_unknown_dwarf_399996 *)local_2a0._M_head_impl,(istream *)local_2a8,local_2e8,
                 (optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)local_278);
      if ((__node_base *)local_2e0._M_buckets != &local_2e0._M_before_begin) {
        operator_delete(local_2e0._M_buckets,
                        (ulong)((long)&(local_2e0._M_before_begin._M_nxt)->_M_nxt + 1));
      }
      if (local_240 == true) {
        local_240 = false;
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_278);
      }
      std::ifstream::~ifstream(local_238);
      return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
             (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)_Var2._M_head_impl;
    }
    if (local_2e0._M_bucket_count == 0) break;
    pvVar5 = memchr(local_2e0._M_buckets,0x2c,local_2e0._M_bucket_count);
    if ((pvVar5 == (void *)0x0) || (__n = (long)pvVar5 - (long)pp_Var1, __n == 0xffffffffffffffff))
    break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_308,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e0,0,__n
              );
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_298,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e0,
               __n + 1,0xffffffffffffffff);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_278,&local_308,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
  }
  pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,"expected a comma but didn\'t get one","");
  GraphFileError::GraphFileError(pGVar6,local_2e8,&local_308,true);
  __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
}

Assistant:

auto read_csv_name(std::istream && infile, const std::string & filename, const std::string & name_map_filename) -> InputGraph
{
    ifstream name_map_file{name_map_filename};
    if (! name_map_file)
        throw GraphFileError{name_map_filename, "could not open rename map file", false};

    optional<unordered_map<string, string>> rename_map{unordered_map<string, string>{}};

    string line;
    while (getline(name_map_file, line)) {
        auto pos = line.find(',');
        if (string::npos == pos)
            throw GraphFileError{filename, "expected a comma but didn't get one", true};
        string left = line.substr(0, pos), right = line.substr(pos + 1);
        rename_map->emplace(left, right);
    }

    return read_csv(move(infile), filename, rename_map);
}